

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_code.cc
# Opt level: O0

void re2c::exact_uint(OutputFile *o,size_t width)

{
  OutputFile *pOVar1;
  size_t width_local;
  OutputFile *o_local;
  
  if (width == 1) {
    OutputFile::ws(o,"unsigned char");
  }
  else if (width == 2) {
    OutputFile::ws(o,"unsigned short");
  }
  else if (width == 4) {
    OutputFile::ws(o,"unsigned int");
  }
  else if (width == 8) {
    OutputFile::ws(o,"unsigned long");
  }
  else {
    pOVar1 = OutputFile::ws(o,"uint");
    pOVar1 = OutputFile::wu64(pOVar1,width << 3);
    OutputFile::ws(pOVar1,"_t");
  }
  return;
}

Assistant:

static void exact_uint (OutputFile & o, size_t width)
{
	if (width == sizeof (char))
	{
		o.ws("unsigned char");
	}
	else if (width == sizeof (short))
	{
		o.ws("unsigned short");
	}
	else if (width == sizeof (int))
	{
		o.ws("unsigned int");
	}
	else if (width == sizeof (long))
	{
		o.ws("unsigned long");
	}
	else
	{
		o.ws("uint").wu64 (width * 8).ws("_t");
	}
}